

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_analysis.cc
# Opt level: O2

void absl::lts_20250127::cord_internal::anon_unknown_0::
     AnalyzeBtree<(absl::lts_20250127::cord_internal::(anonymous_namespace)::Mode)1>
               (CordRepRef<(absl::lts_20250127::cord_internal::(anonymous_namespace)::Mode)1> rep,
               RawUsage<(absl::lts_20250127::cord_internal::(anonymous_namespace)::Mode)1>
               *raw_usage)

{
  byte bVar1;
  byte bVar2;
  CordRepBtree *pCVar3;
  long lVar4;
  
  raw_usage->total = raw_usage->total + 0x40;
  pCVar3 = CordRep::btree(rep.rep);
  bVar1 = (pCVar3->super_CordRep).storage[1];
  bVar2 = (pCVar3->super_CordRep).storage[2];
  if ((pCVar3->super_CordRep).storage[0] == '\0') {
    for (lVar4 = (ulong)bVar1 << 3; (ulong)bVar2 * 8 != lVar4; lVar4 = lVar4 + 8) {
      AnalyzeDataEdge<(absl::lts_20250127::cord_internal::(anonymous_namespace)::Mode)1>
                (*(Nonnull<const_CordRep_*> *)((long)pCVar3->edges_ + lVar4),raw_usage);
    }
  }
  else {
    for (lVar4 = (ulong)bVar1 << 3; (ulong)bVar2 * 8 != lVar4; lVar4 = lVar4 + 8) {
      AnalyzeBtree<(absl::lts_20250127::cord_internal::(anonymous_namespace)::Mode)1>
                (*(Nonnull<const_CordRep_*> *)((long)pCVar3->edges_ + lVar4),raw_usage);
    }
  }
  return;
}

Assistant:

void AnalyzeBtree(CordRepRef<mode> rep, RawUsage<mode>& raw_usage) {
  raw_usage.Add(sizeof(CordRepBtree), rep);
  const CordRepBtree* tree = rep.rep->btree();
  if (tree->height() > 0) {
    for (CordRep* edge : tree->Edges()) {
      AnalyzeBtree(rep.Child(edge), raw_usage);
    }
  } else {
    for (CordRep* edge : tree->Edges()) {
      AnalyzeDataEdge(rep.Child(edge), raw_usage);
    }
  }
}